

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readDbPage(PgHdr *pPg,u32 iFrame)

{
  Pgno PVar1;
  Pager *pPVar2;
  void *pvVar3;
  u8 *dbFileVers;
  i64 iOffset;
  int local_28;
  int pgsz;
  int rc;
  Pgno pgno;
  Pager *pPager;
  u32 iFrame_local;
  PgHdr *pPg_local;
  
  pPVar2 = pPg->pPager;
  PVar1 = pPg->pgno;
  if (iFrame == 0) {
    local_28 = sqlite3OsRead(pPVar2->fd,pPg->pData,pPVar2->pageSize,
                             (ulong)(PVar1 - 1) * (long)pPVar2->pageSize);
    if (local_28 == 0x20a) {
      local_28 = 0;
    }
  }
  else {
    local_28 = sqlite3WalReadFrame(pPVar2->pWal,iFrame,pPVar2->pageSize,(u8 *)pPg->pData);
  }
  if (PVar1 == 1) {
    if (local_28 == 0) {
      pvVar3 = pPg->pData;
      *(undefined8 *)pPVar2->dbFileVers = *(undefined8 *)((long)pvVar3 + 0x18);
      *(undefined8 *)(pPVar2->dbFileVers + 8) = *(undefined8 *)((long)pvVar3 + 0x20);
    }
    else {
      memset(pPVar2->dbFileVers,0xff,0x10);
    }
  }
  return local_28;
}

Assistant:

static int readDbPage(PgHdr *pPg, u32 iFrame){
  Pager *pPager = pPg->pPager; /* Pager object associated with page pPg */
  Pgno pgno = pPg->pgno;       /* Page number to read */
  int rc = SQLITE_OK;          /* Return code */
  int pgsz = pPager->pageSize; /* Number of bytes to read */

  assert( pPager->eState>=PAGER_READER && !MEMDB );
  assert( isOpen(pPager->fd) );

#ifndef SQLITE_OMIT_WAL
  if( iFrame ){
    /* Try to pull the page from the write-ahead log. */
    rc = sqlite3WalReadFrame(pPager->pWal, iFrame, pgsz, pPg->pData);
  }else
#endif
  {
    i64 iOffset = (pgno-1)*(i64)pPager->pageSize;
    rc = sqlite3OsRead(pPager->fd, pPg->pData, pgsz, iOffset);
    if( rc==SQLITE_IOERR_SHORT_READ ){
      rc = SQLITE_OK;
    }
  }

  if( pgno==1 ){
    if( rc ){
      /* If the read is unsuccessful, set the dbFileVers[] to something
      ** that will never be a valid file version.  dbFileVers[] is a copy
      ** of bytes 24..39 of the database.  Bytes 28..31 should always be
      ** zero or the size of the database in page. Bytes 32..35 and 35..39
      ** should be page numbers which are never 0xffffffff.  So filling
      ** pPager->dbFileVers[] with all 0xff bytes should suffice.
      **
      ** For an encrypted database, the situation is more complex:  bytes
      ** 24..39 of the database are white noise.  But the probability of
      ** white noise equaling 16 bytes of 0xff is vanishingly small so
      ** we should still be ok.
      */
      memset(pPager->dbFileVers, 0xff, sizeof(pPager->dbFileVers));
    }else{
      u8 *dbFileVers = &((u8*)pPg->pData)[24];
      memcpy(&pPager->dbFileVers, dbFileVers, sizeof(pPager->dbFileVers));
    }
  }
  CODEC1(pPager, pPg->pData, pgno, 3, rc = SQLITE_NOMEM_BKPT);

  PAGER_INCR(sqlite3_pager_readdb_count);
  PAGER_INCR(pPager->nRead);
  IOTRACE(("PGIN %p %d\n", pPager, pgno));
  PAGERTRACE(("FETCH %d page %d hash(%08x)\n",
               PAGERID(pPager), pgno, pager_pagehash(pPg)));

  return rc;
}